

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

DescriptorProto * __thiscall
perfetto::protos::gen::DescriptorProto::operator=(DescriptorProto *this,DescriptorProto *param_1)

{
  DescriptorProto *param_1_local;
  DescriptorProto *this_local;
  
  protozero::CppMessageObj::operator=(&this->super_CppMessageObj,&param_1->super_CppMessageObj);
  ::std::__cxx11::string::operator=((string *)&this->name_,(string *)&param_1->name_);
  std::
  vector<perfetto::protos::gen::FieldDescriptorProto,_std::allocator<perfetto::protos::gen::FieldDescriptorProto>_>
  ::operator=(&this->field_,&param_1->field_);
  std::
  vector<perfetto::protos::gen::FieldDescriptorProto,_std::allocator<perfetto::protos::gen::FieldDescriptorProto>_>
  ::operator=(&this->extension_,&param_1->extension_);
  std::
  vector<perfetto::protos::gen::DescriptorProto,_std::allocator<perfetto::protos::gen::DescriptorProto>_>
  ::operator=(&this->nested_type_,&param_1->nested_type_);
  std::
  vector<perfetto::protos::gen::EnumDescriptorProto,_std::allocator<perfetto::protos::gen::EnumDescriptorProto>_>
  ::operator=(&this->enum_type_,&param_1->enum_type_);
  std::
  vector<perfetto::protos::gen::OneofDescriptorProto,_std::allocator<perfetto::protos::gen::OneofDescriptorProto>_>
  ::operator=(&this->oneof_decl_,&param_1->oneof_decl_);
  std::
  vector<perfetto::protos::gen::DescriptorProto_ReservedRange,_std::allocator<perfetto::protos::gen::DescriptorProto_ReservedRange>_>
  ::operator=(&this->reserved_range_,&param_1->reserved_range_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->reserved_name_,&param_1->reserved_name_);
  ::std::__cxx11::string::operator=
            ((string *)&this->unknown_fields_,(string *)&param_1->unknown_fields_);
  (this->_has_field_).super__Base_bitset<1UL>._M_w =
       (param_1->_has_field_).super__Base_bitset<1UL>._M_w;
  return this;
}

Assistant:

bool DescriptorProto::operator==(const DescriptorProto& other) const {
  return unknown_fields_ == other.unknown_fields_
   && name_ == other.name_
   && field_ == other.field_
   && extension_ == other.extension_
   && nested_type_ == other.nested_type_
   && enum_type_ == other.enum_type_
   && oneof_decl_ == other.oneof_decl_
   && reserved_range_ == other.reserved_range_
   && reserved_name_ == other.reserved_name_;
}